

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bandwidth_limit.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::bandwidth_channel::update_quota(bandwidth_channel *this,int dt_milliseconds)

{
  long *plVar1;
  long local_30 [3];
  int64_t to_add;
  bandwidth_channel *pbStack_10;
  int dt_milliseconds_local;
  bandwidth_channel *this_local;
  
  if (this->m_limit != 0) {
    local_30[2] = ((long)this->m_limit * (long)dt_milliseconds + 500) / 1000;
    to_add._4_4_ = dt_milliseconds;
    pbStack_10 = this;
    if (0x7fffffff - this->m_quota_left < local_30[2]) {
      this->m_quota_left = 0x7fffffff;
    }
    else {
      this->m_quota_left = local_30[2] + this->m_quota_left;
      if ((long)this->m_limit < this->m_quota_left / 3) {
        this->m_quota_left = (long)this->m_limit * 3;
      }
      local_30[1] = 0x7fffffff;
      plVar1 = ::std::min<long>(&this->m_quota_left,local_30 + 1);
      this->m_quota_left = *plVar1;
    }
    local_30[0] = 0;
    plVar1 = ::std::max<long>(&this->m_quota_left,local_30);
    this->distribute_quota = (int)*plVar1;
  }
  return;
}

Assistant:

void bandwidth_channel::update_quota(int const dt_milliseconds)
	{
		TORRENT_ASSERT_VAL(m_limit >= 0, m_limit);
		TORRENT_ASSERT_VAL(m_limit < inf, m_limit);

		if (m_limit == 0) return;

		// "to_add" should never have int64 overflow: "m_limit" contains < "<int>::max"
		std::int64_t const to_add = (std::int64_t(m_limit) * dt_milliseconds + 500) / 1000;

		if (to_add > inf - m_quota_left)
		{
			m_quota_left = inf;
		}
		else
		{
			m_quota_left += to_add;
			if (m_quota_left / 3 > m_limit) m_quota_left = std::int64_t(m_limit) * 3;
			// "m_quota_left" will never have int64 overflow but may exceed "<int>::max"
			m_quota_left = std::min(m_quota_left, std::int64_t(inf));
		}

		distribute_quota = int(std::max(m_quota_left, std::int64_t(0)));
	}